

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

complex<double> __thiscall
TPZMatrix<std::complex<double>_>::ConditionNumber
          (TPZMatrix<std::complex<double>_> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  complex<double> cVar2;
  complex<double> invnorm;
  complex<double> local_d8;
  complex<double> local_c8;
  TPZFMatrix<std::complex<double>_> local_b8;
  
  local_b8.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
  local_b8.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
  local_b8.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_b8.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_b8.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_b8.fElem = (complex<double> *)0x0;
  local_b8.fGiven = (complex<double> *)0x0;
  local_b8.fSize = 0;
  TPZVec<int>::TPZVec(&local_b8.fPivot.super_TPZVec<int>,0);
  local_b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_b8.fPivot.super_TPZVec<int>.fStore = local_b8.fPivot.fExtAlloc;
  local_b8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  local_b8.fWork.fStore = (complex<double> *)0x0;
  local_b8.fWork.fNElements = 0;
  local_b8.fWork.fNAlloc = 0;
  MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_b8,ENoDecompose);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<std::complex<double>>::ConditionNumber(int, int64_t, REAL) [TVar = std::complex<double>]"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - it was not possible to compute the inverse matrix.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  else {
    MatrixNorm(&local_b8.super_TPZMatrix<std::complex<double>_>,p,numiter,tol);
    std::complex<double>::operator*=(&local_c8,&local_d8);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_b8);
  cVar2._M_value._8_8_ = extraout_RDX;
  cVar2._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar2._M_value;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}